

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

EGLint __thiscall
deqp::egl::GetConfigAttribCase::getValue
          (GetConfigAttribCase *this,EGLConfig config,EGLenum attrib,bool logValue)

{
  TestLog *log;
  deUint32 err;
  undefined8 in_RAX;
  undefined7 in_register_00000009;
  EGLint value;
  EGLint local_24;
  
  local_24 = (EGLint)((ulong)in_RAX >> 0x20);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  eglu::CallLogWrapper::eglGetConfigAttrib
            (&this->super_CallLogWrapper,this->m_display,config,attrib,&local_24);
  err = eglu::CallLogWrapper::eglGetError(&this->super_CallLogWrapper);
  eglu::checkError(err,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryConfigTests.cpp"
                   ,0x113);
  if ((int)CONCAT71(in_register_00000009,logValue) != 0) {
    logConfigAttribute(log,attrib,local_24);
  }
  return local_24;
}

Assistant:

EGLint GetConfigAttribCase::getValue (EGLConfig config, EGLenum attrib, bool logValue)
{
	TestLog&	log		= m_testCtx.getLog();
	EGLint		value;

	eglGetConfigAttrib(m_display, config, attrib, &value);
	eglu::checkError(eglGetError(), DE_NULL, __FILE__, __LINE__);

	if (logValue)
		logConfigAttribute(log, attrib, value);

	return value;
}